

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O3

bool __thiscall ON_HermiteSurface::Create(ON_HermiteSurface *this,int u_count,int v_count)

{
  uint uVar1;
  double *pdVar2;
  ON_3dVector *pOVar3;
  undefined1 auVar4 [16];
  double dVar5;
  ON_SimpleArray<ON_3dPoint> *this_00;
  ON_SimpleArray<ON_3dVector> *pOVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  Destroy(this);
  if (1 < v_count && 1 < u_count) {
    this->m_u_count = u_count;
    this->m_v_count = v_count;
    ON_SimpleArray<double>::SetCapacity(&this->m_u_parameters,(ulong)(uint)u_count);
    iVar9 = this->m_u_count;
    if ((-1 < (long)iVar9) && (iVar9 <= (this->m_u_parameters).m_capacity)) {
      (this->m_u_parameters).m_count = iVar9;
    }
    auVar4 = _DAT_0069b120;
    if (0 < iVar9) {
      pdVar2 = (this->m_u_parameters).m_a;
      lVar7 = (long)iVar9 + -1;
      auVar11._8_4_ = (int)lVar7;
      auVar11._0_8_ = lVar7;
      auVar11._12_4_ = (int)((ulong)lVar7 >> 0x20);
      lVar7 = 0;
      auVar11 = auVar11 ^ _DAT_0069b120;
      auVar14 = _DAT_0069b170;
      do {
        auVar13 = auVar14 ^ auVar4;
        if ((bool)(~(auVar13._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar13._0_4_ ||
                    auVar11._4_4_ < auVar13._4_4_) & 1)) {
          *(undefined8 *)((long)pdVar2 + lVar7) = 0xffe5f8bd9e331dd2;
        }
        if ((auVar13._12_4_ != auVar11._12_4_ || auVar13._8_4_ <= auVar11._8_4_) &&
            auVar13._12_4_ <= auVar11._12_4_) {
          *(undefined8 *)((long)pdVar2 + lVar7 + 8) = 0xffe5f8bd9e331dd2;
        }
        lVar10 = auVar14._8_8_;
        auVar14._0_8_ = auVar14._0_8_ + 2;
        auVar14._8_8_ = lVar10 + 2;
        lVar7 = lVar7 + 0x10;
      } while ((ulong)(iVar9 + 1U >> 1) << 4 != lVar7);
    }
    ON_SimpleArray<double>::SetCapacity(&this->m_v_parameters,(long)this->m_v_count);
    iVar9 = this->m_v_count;
    if ((-1 < (long)iVar9) && (iVar9 <= (this->m_v_parameters).m_capacity)) {
      (this->m_v_parameters).m_count = iVar9;
    }
    auVar4 = _DAT_0069b120;
    if (0 < iVar9) {
      pdVar2 = (this->m_v_parameters).m_a;
      lVar7 = (long)iVar9 + -1;
      auVar12._8_4_ = (int)lVar7;
      auVar12._0_8_ = lVar7;
      auVar12._12_4_ = (int)((ulong)lVar7 >> 0x20);
      lVar7 = 0;
      auVar12 = auVar12 ^ _DAT_0069b120;
      auVar13 = _DAT_0069b170;
      do {
        auVar14 = auVar13 ^ auVar4;
        if ((bool)(~(auVar14._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar14._0_4_ ||
                    auVar12._4_4_ < auVar14._4_4_) & 1)) {
          *(undefined8 *)((long)pdVar2 + lVar7) = 0xffe5f8bd9e331dd2;
        }
        if ((auVar14._12_4_ != auVar12._12_4_ || auVar14._8_4_ <= auVar12._8_4_) &&
            auVar14._12_4_ <= auVar12._12_4_) {
          *(undefined8 *)((long)pdVar2 + lVar7 + 8) = 0xffe5f8bd9e331dd2;
        }
        lVar10 = auVar13._8_8_;
        auVar13._0_8_ = auVar13._0_8_ + 2;
        auVar13._8_8_ = lVar10 + 2;
        lVar7 = lVar7 + 0x10;
      } while ((ulong)(iVar9 + 1U >> 1) << 4 != lVar7);
    }
    ON_ClassArray<ON_SimpleArray<ON_3dPoint>_>::SetCapacity
              (&this->m_grid_points,(long)this->m_u_count);
    iVar9 = this->m_u_count;
    if (0 < iVar9) {
      iVar8 = 0;
      do {
        this_00 = ON_ClassArray<ON_SimpleArray<ON_3dPoint>_>::AppendNew(&this->m_grid_points);
        ON_SimpleArray<ON_3dPoint>::SetCapacity(this_00,(long)this->m_v_count);
        iVar9 = this->m_v_count;
        uVar1 = this_00->m_capacity;
        if (iVar9 <= (int)uVar1 && -1 < iVar9) {
          this_00->m_count = iVar9;
        }
        if (0 < (int)uVar1 && this_00->m_a != (ON_3dPoint *)0x0) {
          memset(this_00->m_a,0,(ulong)uVar1 * 0x18);
        }
        iVar8 = iVar8 + 1;
        iVar9 = this->m_u_count;
      } while (iVar8 < iVar9);
    }
    ON_ClassArray<ON_SimpleArray<ON_3dVector>_>::SetCapacity(&this->m_u_tangents,(long)iVar9);
    iVar9 = this->m_u_count;
    if (0 < iVar9) {
      iVar8 = 0;
      do {
        pOVar6 = ON_ClassArray<ON_SimpleArray<ON_3dVector>_>::AppendNew(&this->m_u_tangents);
        ON_SimpleArray<ON_3dVector>::SetCapacity(pOVar6,(long)this->m_v_count);
        iVar9 = this->m_v_count;
        if ((-1 < iVar9) && (iVar9 <= pOVar6->m_capacity)) {
          pOVar6->m_count = iVar9;
        }
        if (0 < iVar9) {
          lVar7 = 0;
          lVar10 = 0;
          do {
            ON_3dVector::operator=
                      ((ON_3dVector *)((long)&pOVar6->m_a->x + lVar7),&ON_3dPoint::UnsetPoint);
            lVar10 = lVar10 + 1;
            lVar7 = lVar7 + 0x18;
          } while (lVar10 < this->m_v_count);
        }
        iVar8 = iVar8 + 1;
        iVar9 = this->m_u_count;
      } while (iVar8 < iVar9);
    }
    ON_ClassArray<ON_SimpleArray<ON_3dVector>_>::SetCapacity(&this->m_v_tangents,(long)iVar9);
    iVar9 = this->m_u_count;
    if (0 < iVar9) {
      iVar8 = 0;
      do {
        pOVar6 = ON_ClassArray<ON_SimpleArray<ON_3dVector>_>::AppendNew(&this->m_v_tangents);
        ON_SimpleArray<ON_3dVector>::SetCapacity(pOVar6,(long)this->m_v_count);
        iVar9 = this->m_v_count;
        if ((-1 < iVar9) && (iVar9 <= pOVar6->m_capacity)) {
          pOVar6->m_count = iVar9;
        }
        if (0 < iVar9) {
          lVar7 = 0;
          lVar10 = 0;
          do {
            pOVar3 = pOVar6->m_a;
            *(double *)((long)&pOVar3->z + lVar7) = ON_3dVector::UnsetVector.z;
            dVar5 = ON_3dVector::UnsetVector.y;
            pdVar2 = (double *)((long)&pOVar3->x + lVar7);
            *pdVar2 = ON_3dVector::UnsetVector.x;
            pdVar2[1] = dVar5;
            lVar10 = lVar10 + 1;
            lVar7 = lVar7 + 0x18;
          } while (lVar10 < this->m_v_count);
        }
        iVar8 = iVar8 + 1;
        iVar9 = this->m_u_count;
      } while (iVar8 < iVar9);
    }
    ON_ClassArray<ON_SimpleArray<ON_3dVector>_>::SetCapacity(&this->m_twists,(long)iVar9);
    if (0 < this->m_u_count) {
      iVar9 = 0;
      do {
        pOVar6 = ON_ClassArray<ON_SimpleArray<ON_3dVector>_>::AppendNew(&this->m_twists);
        ON_SimpleArray<ON_3dVector>::SetCapacity(pOVar6,(long)this->m_v_count);
        iVar8 = this->m_v_count;
        if ((-1 < iVar8) && (iVar8 <= pOVar6->m_capacity)) {
          pOVar6->m_count = iVar8;
        }
        if (0 < iVar8) {
          lVar7 = 0;
          lVar10 = 0;
          do {
            pOVar3 = pOVar6->m_a;
            *(double *)((long)&pOVar3->z + lVar7) = ON_3dVector::UnsetVector.z;
            dVar5 = ON_3dVector::UnsetVector.y;
            pdVar2 = (double *)((long)&pOVar3->x + lVar7);
            *pdVar2 = ON_3dVector::UnsetVector.x;
            pdVar2[1] = dVar5;
            lVar10 = lVar10 + 1;
            lVar7 = lVar7 + 0x18;
          } while (lVar10 < this->m_v_count);
        }
        iVar9 = iVar9 + 1;
      } while (iVar9 < this->m_u_count);
    }
  }
  return 1 < v_count && 1 < u_count;
}

Assistant:

bool ON_HermiteSurface::Create(int u_count, int v_count)
{
  Destroy();

  if (u_count < 2 || v_count < 2)
    return false;

  m_u_count = u_count;
  m_v_count = v_count;

  m_u_parameters.SetCapacity(m_u_count);
  m_u_parameters.SetCount(m_u_count);
  for (int i = 0; i < m_u_count; i++)
    m_u_parameters[i] = ON_UNSET_VALUE;

  m_v_parameters.SetCapacity(m_v_count);
  m_v_parameters.SetCount(m_v_count);
  for (int i = 0; i < m_v_count; i++)
    m_v_parameters[i] = ON_UNSET_VALUE;

  m_grid_points.SetCapacity(m_u_count);
  for (int i = 0; i < m_u_count; i++)
  {
    ON_SimpleArray<ON_3dPoint>& arr = m_grid_points.AppendNew();
    arr.SetCapacity(m_v_count);
    arr.SetCount(m_v_count);
    arr.Zero();
  }

  m_u_tangents.SetCapacity(m_u_count);
  for (int i = 0; i < m_u_count; i++)
  {
    ON_SimpleArray<ON_3dVector>& arr = m_u_tangents.AppendNew();
    arr.SetCapacity(m_v_count);
    arr.SetCount(m_v_count);
    for (int j = 0; j < m_v_count; j++)
      arr[j] = ON_3dPoint::UnsetPoint;
  }

  m_v_tangents.SetCapacity(m_u_count);
  for (int i = 0; i < m_u_count; i++)
  {
    ON_SimpleArray<ON_3dVector>& arr = m_v_tangents.AppendNew();
    arr.SetCapacity(m_v_count);
    arr.SetCount(m_v_count);
    for (int j = 0; j < m_v_count; j++)
      arr[j] = ON_3dVector::UnsetVector;
  }

  m_twists.SetCapacity(m_u_count);
  for (int i = 0; i < m_u_count; i++)
  {
    ON_SimpleArray<ON_3dVector>& arr = m_twists.AppendNew();
    arr.SetCapacity(m_v_count);
    arr.SetCount(m_v_count);
    for (int j = 0; j < m_v_count; j++)
      arr[j] = ON_3dVector::UnsetVector;
  }

  return true;
}